

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

int __thiscall wasm::SExpressionWasmBuilder::parseIndex(SExpressionWasmBuilder *this,Element *s)

{
  int iVar1;
  string local_40;
  
  Element::toString_abi_cxx11_(&local_40,s);
  iVar1 = std::__cxx11::stoi(&local_40,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_40);
  return iVar1;
}

Assistant:

int SExpressionWasmBuilder::parseIndex(Element& s) {
  try {
    return std::stoi(s.toString());
  } catch (...) {
    throw ParseException("expected integer", s.line, s.col);
  }
}